

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffnkey(int value,char *keyroot,char *keyname,int *status)

{
  size_t sVar1;
  size_t sVar2;
  
  *keyname = '\0';
  sVar1 = strlen(keyroot);
  if (-1 < value && 0xfffffffffffffff8 < sVar1 - 8) {
    snprintf(keyname,0x47,"%d",value);
    sVar2 = strlen(keyname);
    if (sVar2 + sVar1 < 9) {
      strcat(keyname,keyroot);
      return *status;
    }
  }
  *status = 0xce;
  return 0xce;
}

Assistant:

int ffnkey(int value,       /* I - index number to be appended to root name */
           const char *keyroot,   /* I - root string for keyword name */
           char *keyname,   /* O - output root + index keyword name */
           int *status)     /* IO - error status  */
/*
  Construct a keyword name string by appending the root string to the index
  number. e.g., if root = "TTYPE" and value = 12 then keyname = "12TTYPE".
*/
{
    size_t rootlen;

    keyname[0] = '\0';            /* initialize output name to null */
    rootlen = strlen(keyroot);

    if (rootlen == 0 || rootlen > 7 || value < 0 )
       return(*status = 206);

    snprintf(keyname, FLEN_VALUE,"%d", value); /* construct keyword prefix */

    if (rootlen +  strlen(keyname) > 8)
       return(*status = 206);

    strcat(keyname, keyroot);  /* append root to the prefix */
    return(*status);
}